

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

char * UTF_fgets<char>(char *str,int count,FILE *fp)

{
  ulong __n;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (count < 1) {
    return (char *)0x0;
  }
  __n = (ulong)(uint)count;
  iVar1 = feof((FILE *)fp);
  if ((iVar1 == 0) && (sVar3 = fread(str,1,__n,(FILE *)fp), sVar3 != 0)) {
    for (uVar4 = 0; uVar5 = sVar3, sVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (str[uVar4] == '\n') {
        if ((uVar4 == 0) || (str[uVar4 - 1] != '\r')) {
          uVar5 = uVar4 + 1;
          if (__n - 1 == uVar4) {
            uVar5 = uVar4;
          }
          str[uVar5] = '\0';
        }
        else {
          (str + (uVar4 - 1))[0] = '\n';
          (str + (uVar4 - 1))[1] = '\0';
          uVar5 = uVar4 + 1;
        }
        break;
      }
    }
    if (uVar5 == __n) {
      str[__n - 1] = '\0';
      uVar5 = __n - 1;
LAB_0010388e:
      if ((uVar5 - sVar3 != 0) && (iVar1 = fseek((FILE *)fp,uVar5 - sVar3,1), iVar1 != 0))
      goto LAB_00103802;
    }
    else {
      if (uVar5 != sVar3) goto LAB_0010388e;
      str[sVar3] = '\0';
    }
    pcVar2 = (char *)0x0;
    if (*str != '\0') {
      pcVar2 = str;
    }
  }
  else {
LAB_00103802:
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

inline UT *
UTF_fgets(UT *str, int count, FILE *fp)
{
    size_t i, cw;
    long diff;
    if (count <= 0 || feof(fp))
        return NULL;

    cw = fread(str, sizeof(UT), UTF_STATIC_CAST(size_t, count), fp);
    if (!cw)
        return NULL;

    for (i = 0; i < cw; ++i)
    {
        if (str[i] == '\n')
        {
            if (i && str[i - 1] == '\r')
            {
                str[i - 1] = '\n';
                str[i] = 0;
                ++i;
            }
            else
            {
                if (i + 1 != count)
                {
                    ++i;
                }
                str[i] = 0;
            }
            break;
        }
    }

    if (i == count)
    {
        --i;
        str[i] = 0;
    }
    else if (i == cw && cw != count)
    {
        str[i] = 0;
    }

    if (i != cw)
    {
        diff = UTF_STATIC_CAST(long, i) - UTF_STATIC_CAST(long, cw);
        diff *= UTF_STATIC_CAST(long, sizeof(UT));
        if (fseek(fp, diff, SEEK_CUR) != 0)
            return NULL;
    }
    return str[0] ? str : NULL;
}